

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.h
# Opt level: O0

void __thiscall tetgenbehavior::tetgenbehavior(tetgenbehavior *this)

{
  tetgenbehavior *this_local;
  
  this->plc = 0;
  this->psc = 0;
  this->refine = 0;
  this->quality = 0;
  this->nobisect = 0;
  this->coarsen = 0;
  this->metric = 0;
  this->weighted = 0;
  this->brio_hilbert = 1;
  this->incrflip = 0;
  this->flipinsert = 0;
  this->varvolume = 0;
  this->fixedvolume = 0;
  this->noexact = 0;
  this->nostaticfilter = 0;
  this->insertaddpoints = 0;
  this->regionattrib = 0;
  this->cdtrefine = 0;
  this->diagnose = 0;
  this->convex = 0;
  this->zeroindex = 0;
  this->facesout = 0;
  this->edgesout = 0;
  this->neighout = 0;
  this->voroout = 0;
  this->meditview = 0;
  this->vtkview = 0;
  this->nobound = 0;
  this->nonodewritten = 0;
  this->noelewritten = 0;
  this->nofacewritten = 0;
  this->noiterationnum = 0;
  this->nomergefacet = 0;
  this->nomergevertex = 0;
  this->nojettison = 0;
  this->docheck = 0;
  this->quiet = 0;
  this->verbose = 0;
  this->vertexperblock = 0xffc;
  this->tetrahedraperblock = 0x1ffc;
  this->shellfaceperblock = 0xffc;
  this->nobisect_nomerge = 1;
  this->supsteiner_level = 2;
  this->addsteiner_algo = 1;
  this->coarsen_param = 0;
  this->weighted_param = 0;
  this->fliplinklevel = -1;
  this->flipstarsize = -1;
  this->fliplinklevelinc = 1;
  this->reflevel = 3;
  this->optscheme = 7;
  this->optlevel = 2;
  this->delmaxfliplevel = 1;
  this->order = 1;
  this->reversetetori = 0;
  this->steinerleft = -1;
  this->no_sort = 0;
  this->hilbert_order = 0x34;
  this->hilbert_limit = 8;
  this->brio_threshold = 0x40;
  this->brio_ratio = 0.125;
  this->facet_separate_ang_tol = 179.9;
  this->facet_overlap_ang_tol = 0.1;
  this->facet_small_ang_tol = 15.0;
  this->maxvolume = -1.0;
  this->minratio = 2.0;
  this->mindihedral = 0.0;
  this->optmaxdihedral = 165.0;
  this->optminsmtdihed = 179.0;
  this->optminslidihed = 179.0;
  this->epsilon = 1e-08;
  this->coarsen_percent = 1.0;
  this->object = NODES;
  this->commandline[0] = '\0';
  this->infilename[0] = '\0';
  this->outfilename[0] = '\0';
  this->addinfilename[0] = '\0';
  this->bgmeshfilename[0] = '\0';
  return;
}

Assistant:

tetgenbehavior()
  {
    plc = 0;
    psc = 0;
    refine = 0;
    quality = 0;
    nobisect = 0;
    coarsen = 0;
    metric = 0;
    weighted = 0;
    brio_hilbert = 1;
    incrflip = 0;
    flipinsert = 0;
    varvolume = 0;
    fixedvolume = 0;
    noexact = 0;
    nostaticfilter = 0;
    insertaddpoints = 0;
    regionattrib = 0;
    cdtrefine = 0;
    diagnose = 0;
    convex = 0;
    zeroindex = 0;
    facesout = 0;
    edgesout = 0;
    neighout = 0;
    voroout = 0;
    meditview = 0;
    vtkview = 0;
    nobound = 0;
    nonodewritten = 0;
    noelewritten = 0;
    nofacewritten = 0;
    noiterationnum = 0;
    nomergefacet = 0;
    nomergevertex = 0;
    nojettison = 0;
    docheck = 0;
    quiet = 0;
    verbose = 0;

    vertexperblock = 4092;
    tetrahedraperblock = 8188;
    shellfaceperblock = 4092;
    nobisect_nomerge = 1;
    supsteiner_level = 2;
    addsteiner_algo = 1;
    coarsen_param = 0;
    weighted_param = 0;
    fliplinklevel = -1; 
    flipstarsize = -1;  
    fliplinklevelinc = 1;
    reflevel = 3;
    optscheme = 7;  
    optlevel = 2;
    delmaxfliplevel = 1;
    order = 1;
    reversetetori = 0;
    steinerleft = -1;
    no_sort = 0;
    hilbert_order = 52; //-1;
    hilbert_limit = 8;
    brio_threshold = 64;
    brio_ratio = 0.125;
    facet_separate_ang_tol = 179.9;
    facet_overlap_ang_tol = 0.1;
    facet_small_ang_tol = 15.0;
    maxvolume = -1.0;
    minratio = 2.0;
    mindihedral = 0.0;
    optmaxdihedral = 165.00;
    optminsmtdihed = 179.00;
    optminslidihed = 179.00;
    epsilon = 1.0e-8;
    coarsen_percent = 1.0;
    object = NODES;

    commandline[0] = '\0';
    infilename[0] = '\0';
    outfilename[0] = '\0';
    addinfilename[0] = '\0';
    bgmeshfilename[0] = '\0';

  }